

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O3

void util::ThreadRename(string *name)

{
  long lVar1;
  size_t __n;
  long *in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = in_FS_OFFSET[5];
  std::operator+(&local_40,"b-",name);
  prctl(0xf,local_40._M_dataplus._M_p,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  __n = 0x7f;
  if (name->_M_string_length < 0x7f) {
    __n = name->_M_string_length;
  }
  lVar1 = *in_FS_OFFSET;
  memcpy((void *)(lVar1 + -0x80),(name->_M_dataplus)._M_p,__n);
  *(undefined1 *)(lVar1 + -0x80 + __n) = 0;
  if (in_FS_OFFSET[5] == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void util::ThreadRename(const std::string& name)
{
    SetThreadName(("b-" + name).c_str());
    SetInternalName(name);
}